

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_MeshTopology::Create(ON_MeshTopology *this)

{
  long lVar1;
  ON_MeshFaceSide *pOVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  ON_MeshFace *pOVar12;
  ON_MeshFaceSide *pOVar13;
  ON_MeshFaceSide *pOVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  ON_MeshTopologyFace *f_local;
  memchunk *pmVar18;
  uint *puVar19;
  ON_MeshTopologyVertex *pOVar20;
  ON_MeshTopologyEdge *pOVar21;
  void *__s;
  memchunk *pmVar22;
  int **ppiVar23;
  ON_MeshTopologyFace *pOVar24;
  uint uVar25;
  long lVar26;
  int *piVar27;
  ulong uVar28;
  int iVar29;
  size_t new_capacity;
  long lVar30;
  size_t sVar31;
  ulong uVar32;
  ulong new_capacity_00;
  ON_MeshFaceSide *e;
  ON_Workspace ws;
  ON_SimpleArray<ON_MeshTopologyVertex> *local_68;
  ON_MeshFaceSide *local_48;
  ON_Workspace local_40;
  
  if (this->m_b32IsValid == 1) {
    return true;
  }
  iVar3 = this->m_b32IsValid;
  if (iVar3 == 0) {
    this->m_b32IsValid = -1;
LAB_0050202a:
    Destroy(this);
    uVar15 = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    if ((ulong)uVar15 == 0) {
LAB_005020fe:
      iVar29 = 0;
    }
    else {
      uVar4 = (this->m_mesh->m_F).m_count;
      new_capacity_00 = (ulong)uVar4;
      sVar31 = (size_t)(int)uVar15;
      if (((int)uVar15 < 1) ||
         (pmVar18 = (memchunk *)onmalloc((ulong)uVar15 * 4 + 8), pmVar18 == (memchunk *)0x0)) {
        pmVar22 = (memchunk *)0x0;
      }
      else {
        pmVar18->next = this->m_memchunk;
        pmVar22 = pmVar18 + 1;
        this->m_memchunk = pmVar18;
      }
      ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar31);
      if ((-1 < (int)uVar15) && ((int)uVar15 <= (this->m_topv_map).m_capacity)) {
        (this->m_topv_map).m_count = uVar15;
      }
      puVar19 = ON_Mesh::GetVertexLocationIds
                          (this->m_mesh,0,(uint *)(this->m_topv_map).m_a,(uint *)pmVar22);
      if (puVar19 == (uint *)0x0) {
        Destroy(this);
        goto LAB_005020fe;
      }
      new_capacity = (long)(this->m_topv_map).m_a[*(uint *)((long)pmVar22 + sVar31 * 4 + -4)] + 1;
      ON_SimpleArray<int>::SetCapacity(&this->m_topv_map,sVar31);
      if (((int)uVar15 < 0) || ((this->m_topv_map).m_capacity < (int)uVar15)) {
        ON_SimpleArray<ON_MeshTopologyVertex>::SetCapacity(&this->m_topv,(long)(int)new_capacity);
        if (0 < (int)uVar15) goto LAB_0050211f;
      }
      else {
        (this->m_topv_map).m_count = uVar15;
        ON_SimpleArray<ON_MeshTopologyVertex>::SetCapacity(&this->m_topv,new_capacity);
LAB_0050211f:
        local_68 = &this->m_topv;
        iVar29 = 0;
        do {
          iVar16 = (this->m_topv).m_count;
          pOVar20 = ON_SimpleArray<ON_MeshTopologyVertex>::AppendNew(local_68);
          lVar26 = (long)iVar29;
          pOVar20->m_vi = (int *)((long)&pmVar22->next + lVar26 * 4);
          lVar30 = 0;
          do {
            if ((long)sVar31 <= lVar26 + 1 + lVar30) {
              uVar25 = iVar29 + 1U;
              if ((int)(iVar29 + 1U) < (int)uVar15) {
                uVar25 = uVar15;
              }
              pOVar20->m_v_count = uVar25 - iVar29;
              goto LAB_0050219b;
            }
            lVar1 = lVar30 * 4;
            lVar30 = lVar30 + 1;
          } while (iVar16 == (this->m_topv_map).m_a
                             [*(uint *)((long)&pmVar22->next + lVar1 + lVar26 * 4 + 4)]);
          iVar29 = iVar29 + (int)lVar30;
          pOVar20->m_v_count = (int)lVar30;
        } while (iVar29 < (int)uVar15);
LAB_0050219b:
        uVar25 = (this->m_topv).m_count;
        if (((1 < (long)(int)uVar25) && (0 < (int)uVar4)) && (0 < (int)uVar15)) {
          ON_Workspace::ON_Workspace(&local_40);
          local_48 = (ON_MeshFaceSide *)ON_Workspace::GetMemory(&local_40,(ulong)(uVar4 * 4) * 0x14)
          ;
          uVar15 = ON_Mesh::GetMeshFaceSideList
                             (this->m_mesh,(uint *)(this->m_topv_map).m_a,&local_48);
          pOVar14 = local_48;
          if (0 < (int)uVar15) {
            uVar32 = (ulong)uVar15;
            ON_MeshFaceSide::SortByVertexIndex(local_48,uVar32);
            lVar26 = 0;
            iVar29 = 0;
            do {
              iVar16 = iVar29;
              lVar26 = (long)(int)lVar26;
              pOVar2 = pOVar14 + lVar26;
              pOVar13 = pOVar14 + lVar26;
              puVar19 = pOVar14[lVar26 + 1].m_vi + 1;
              do {
                lVar26 = lVar26 + 1;
                if ((long)uVar32 <= lVar26) goto LAB_0050226e;
              } while ((((ON_MeshFaceSide *)(puVar19 + -1))->m_vi[0] == pOVar2->m_vi[0]) &&
                      (uVar5 = *puVar19, puVar19 = puVar19 + 5, uVar5 == pOVar13->m_vi[1]));
              iVar29 = iVar16 + 1;
            } while ((int)lVar26 < (int)uVar15);
LAB_0050226e:
            ON_SimpleArray<ON_MeshTopologyEdge>::SetCapacity(&this->m_tope,(ulong)(iVar16 + 1));
            pmVar18 = (memchunk *)onmalloc(uVar32 * 4 + 8);
            iVar29 = 0;
            if (pmVar18 == (memchunk *)0x0) {
              pmVar22 = (memchunk *)0x0;
            }
            else {
              pmVar18->next = this->m_memchunk;
              pmVar22 = pmVar18 + 1;
              this->m_memchunk = pmVar18;
            }
            do {
              pOVar21 = ON_SimpleArray<ON_MeshTopologyEdge>::AppendNew(&this->m_tope);
              uVar5 = pOVar14[iVar29].m_vi[0];
              pOVar21->m_topvi[0] = uVar5;
              uVar6 = pOVar14[iVar29].m_vi[1];
              pOVar21->m_topvi[1] = uVar6;
              pOVar21->m_topfi = (int *)pmVar22;
              pOVar21->m_topf_count = 0;
              *(uint *)&pmVar22->next = pOVar14[iVar29].m_fi;
              pOVar21->m_topf_count = pOVar21->m_topf_count + 1;
              pmVar22 = (memchunk *)((long)&pmVar22->next + 4);
              iVar29 = iVar29 + 1;
              if (iVar29 < (int)uVar15) {
                puVar19 = &pOVar14[iVar29].m_fi;
                lVar26 = 0;
                while ((((ON_MeshFaceSide *)(puVar19 + -2))->m_vi[0] == uVar5 &&
                       (puVar19[-1] == uVar6))) {
                  *(uint *)&pmVar22->next = *puVar19;
                  pOVar21->m_topf_count = pOVar21->m_topf_count + 1;
                  pmVar22 = (memchunk *)((long)&pmVar22->next + 4);
                  lVar26 = lVar26 + -1;
                  puVar19 = puVar19 + 5;
                  if ((long)iVar29 - uVar32 == lVar26) goto LAB_0050234d;
                }
                iVar29 = iVar29 - (int)lVar26;
              }
            } while (iVar29 < (int)uVar15);
LAB_0050234d:
            uVar15 = (this->m_tope).m_count;
            uVar32 = (ulong)uVar15;
            sVar31 = (long)(int)uVar25 * 4;
            __s = onmalloc(sVar31);
            pmVar18 = (memchunk *)0x0;
            memset(__s,0,sVar31);
            if (0 < (int)uVar15) {
              pOVar21 = (this->m_tope).m_a;
              lVar26 = 0;
              do {
                piVar27 = (int *)((long)__s + (long)*(int *)((long)pOVar21->m_topvi + lVar26) * 4);
                *piVar27 = *piVar27 + 1;
                piVar27 = (int *)((long)__s +
                                 (long)*(int *)((long)pOVar21->m_topvi + lVar26 + 4) * 4);
                *piVar27 = *piVar27 + 1;
                lVar26 = lVar26 + 0x18;
              } while (uVar32 * 0x18 != lVar26);
              if (((int)uVar15 < 1) ||
                 (pmVar22 = (memchunk *)onmalloc(uVar32 * 8 + 8), pmVar22 == (memchunk *)0x0)) {
                pmVar18 = (memchunk *)0x0;
              }
              else {
                pmVar22->next = this->m_memchunk;
                pmVar18 = pmVar22 + 1;
                this->m_memchunk = pmVar22;
              }
            }
            ppiVar23 = &((this->m_topv).m_a)->m_topei;
            uVar28 = 0;
            do {
              lVar26 = (long)*(int *)((long)__s + uVar28 * 4);
              if (0 < lVar26) {
                *ppiVar23 = (int *)pmVar18;
                pmVar18 = (memchunk *)((long)&pmVar18->next + lVar26 * 4);
              }
              uVar28 = uVar28 + 1;
              ppiVar23 = ppiVar23 + 4;
            } while (uVar25 != uVar28);
            onfree(__s);
            if (0 < (int)uVar15) {
              pOVar20 = (this->m_topv).m_a;
              piVar27 = ((this->m_tope).m_a)->m_topvi + 1;
              uVar28 = 0;
              do {
                iVar29 = ((ON_MeshTopologyEdge *)(piVar27 + -1))->m_topvi[0];
                iVar16 = *piVar27;
                piVar11 = pOVar20[iVar29].m_topei;
                iVar7 = pOVar20[iVar29].m_tope_count;
                pOVar20[iVar29].m_tope_count = iVar7 + 1;
                piVar11[iVar7] = (int)uVar28;
                piVar11 = pOVar20[iVar16].m_topei;
                iVar29 = pOVar20[iVar16].m_tope_count;
                pOVar20[iVar16].m_tope_count = iVar29 + 1;
                piVar11[iVar29] = (int)uVar28;
                uVar28 = uVar28 + 1;
                piVar27 = piVar27 + 6;
              } while (uVar32 != uVar28);
            }
            ON_SimpleArray<ON_MeshTopologyFace>::SetCapacity(&this->m_topf,new_capacity_00);
            if ((int)uVar4 <= (this->m_topf).m_capacity) {
              (this->m_topf).m_count = uVar4;
            }
            memset((this->m_topf).m_a,0,new_capacity_00 * 0x14);
            pOVar24 = (this->m_topf).m_a;
            uVar28 = new_capacity_00;
            do {
              pOVar24->m_topei[0] = -1;
              pOVar24->m_topei[1] = -1;
              pOVar24->m_topei[2] = -1;
              pOVar24->m_topei[3] = -1;
              pOVar24 = pOVar24 + 1;
              uVar28 = uVar28 - 1;
            } while (uVar28 != 0);
            if (0 < (int)uVar15) {
              uVar28 = 0;
              do {
                pOVar21 = (this->m_tope).m_a;
                if (0 < pOVar21[uVar28].m_topf_count) {
                  pOVar21 = pOVar21 + uVar28;
                  lVar26 = 0;
                  do {
                    iVar29 = pOVar21->m_topfi[lVar26];
                    piVar27 = (this->m_topv_map).m_a;
                    pOVar12 = (this->m_mesh->m_F).m_a;
                    iVar16 = piVar27[pOVar12[iVar29].vi[0]];
                    iVar7 = piVar27[pOVar12[iVar29].vi[1]];
                    iVar8 = piVar27[pOVar12[iVar29].vi[2]];
                    pOVar24 = (this->m_topf).m_a + iVar29;
                    iVar29 = piVar27[pOVar12[iVar29].vi[3]];
                    iVar9 = pOVar21->m_topvi[0];
                    iVar10 = pOVar21->m_topvi[1];
                    iVar17 = (int)uVar28;
                    if ((iVar9 == iVar29) && (iVar10 == iVar16)) {
                      pOVar24->m_topei[0] = iVar17;
                      pOVar24->m_reve[0] = '\0';
                    }
                    else if ((iVar9 == iVar16) && (iVar10 == iVar7)) {
                      pOVar24->m_topei[1] = iVar17;
                      pOVar24->m_reve[1] = '\0';
                    }
                    else if ((iVar9 == iVar7) && (iVar10 == iVar8)) {
                      pOVar24->m_topei[2] = iVar17;
                      pOVar24->m_reve[2] = '\0';
                    }
                    else if ((iVar9 == iVar8) && (iVar10 == iVar29)) {
                      pOVar24->m_topei[3] = iVar17;
                      pOVar24->m_reve[3] = '\0';
                    }
                    else if ((iVar9 == iVar16) && (iVar10 == iVar29)) {
                      pOVar24->m_topei[0] = iVar17;
                      pOVar24->m_reve[0] = '\x01';
                    }
                    else if ((iVar9 == iVar7) && (iVar10 == iVar16)) {
                      pOVar24->m_topei[1] = iVar17;
                      pOVar24->m_reve[1] = '\x01';
                    }
                    else if ((iVar9 == iVar8) && (iVar10 == iVar7)) {
                      pOVar24->m_topei[2] = iVar17;
                      pOVar24->m_reve[2] = '\x01';
                    }
                    else if ((iVar9 == iVar29) && (iVar10 == iVar8)) {
                      pOVar24->m_topei[3] = iVar17;
                      pOVar24->m_reve[3] = '\x01';
                    }
                    lVar26 = lVar26 + 1;
                  } while (lVar26 < pOVar21->m_topf_count);
                }
                uVar28 = uVar28 + 1;
              } while (uVar28 != uVar32);
            }
            lVar26 = 0xc;
            lVar30 = 0xc;
            do {
              pOVar24 = (this->m_topf).m_a;
              iVar29 = *(int *)((long)pOVar24->m_topei + lVar26 + -0xc);
              if (((((iVar29 < 0) ||
                    (iVar16 = *(int *)((long)pOVar24->m_topei + lVar26 + -8), iVar16 < 0)) ||
                   (iVar7 = *(int *)((long)pOVar24->m_topei + lVar26 + -4), iVar7 == iVar29)) ||
                  ((iVar16 == iVar7 || (iVar29 == iVar16)))) || (iVar7 < 0)) {
LAB_00502639:
                *(undefined1 (*) [16])((long)pOVar24->m_topei + lVar26 + -0xc) =
                     (undefined1  [16])0x0;
                *(undefined4 *)((long)pOVar24->m_topei + lVar26 + 4) = 0;
              }
              else {
                pOVar12 = (this->m_mesh->m_F).m_a;
                if (*(int *)((long)pOVar12->vi + lVar30 + -4) ==
                    *(int *)((long)pOVar12->vi + lVar30)) {
                  *(int *)((long)pOVar24->m_topei + lVar26) = iVar7;
                }
                else {
                  iVar8 = *(int *)((long)pOVar24->m_topei + lVar26);
                  if (((iVar7 == iVar8) || (iVar16 == iVar8)) || ((iVar8 < 0 || (iVar29 == iVar8))))
                  goto LAB_00502639;
                }
              }
              lVar30 = lVar30 + 0x10;
              lVar26 = lVar26 + 0x14;
              new_capacity_00 = new_capacity_00 - 1;
            } while (new_capacity_00 != 0);
          }
          ON_Workspace::~ON_Workspace(&local_40);
        }
      }
      iVar29 = 1;
    }
    if (iVar3 == -1) goto LAB_00502678;
  }
  else {
    iVar29 = iVar3;
    if (iVar3 + 1U < 2) goto LAB_0050202a;
  }
  this->m_b32IsValid = iVar29;
LAB_00502678:
  if (iVar29 != 1) {
    Destroy(this);
  }
  return iVar29 == 1;
}

Assistant:

bool ON_MeshTopology::Create()
{
  // When -1 == m_b32IsValid, this ON_MeshTopology
  // is the m_top field on an ON_Mesh and is being
  // created in an ON_Mesh::Topology() call and a
  // sleep lock is used to keep ON_Mesh::Topology()
  // thread safe.
  //
  // When 0 == m_b32IsValid, this ON_MeshTopology
  // is being created stand alone.
  //
  // When 1 == m_b32IsValid, this ON_MeshTopology
  // is already created and valid.

  if ( 1 == m_b32IsValid )
    return true;

  const int b32IsValid0 = m_b32IsValid;

  if ( 0 == b32IsValid0 )
  {
    // no sleep lock is being used
    m_b32IsValid = -1;
  }
  int b32IsValid = b32IsValid0;

  while ( 0 == b32IsValid || -1 == b32IsValid ) 
  {
    // while() is for flow control - this is a while() {... break;} statement.
    Destroy();
    b32IsValid = 0;

    // build vertex topology information
    const int fcount = m_mesh->FaceCount();
    const int vcount = m_mesh->VertexCount();
    if ( 0 == vcount )
      break;

    unsigned int* vindex = (unsigned int*)GetIntArray(vcount);
    m_topv_map.SetCapacity( vcount );
    m_topv_map.SetCount( vcount );
    if (  0 == m_mesh->GetVertexLocationIds( 
      0, // first id
      (unsigned int*)m_topv_map.Array(), // vertex ids returned here
      vindex
      ) )
    {
      Destroy();
      break;
    }

    {
      int topv_count = m_topv_map[vindex[vcount-1]]+1;
      m_topv_map.SetCapacity( vcount );
      m_topv_map.SetCount( vcount );
      m_topv.SetCapacity( topv_count );
      int vt0, vt1, topvi;
      for (vt0 = 0; vt0 < vcount; vt0 = vt1)
      {
        topvi = m_topv.Count();
#if defined(ON_DEBUG)
        if ( topvi != m_topv_map[vindex[vt0]] )
        {
          // 20 April 2010 Dale Lear:
          //  If you get this error, save the mesh and tell Dale Lear.
          ON_ERROR("ON_MeshTopology::Create() - topvi != vertex id from GetVertexLocationIds()");
        }
#endif
        ON_MeshTopologyVertex& topv = m_topv.AppendNew();
        topv.m_vi = (const int*)(vindex+vt0);
        for ( vt1=vt0+1; vt1<vcount && topvi == m_topv_map[vindex[vt1]]; vt1++ ) {
          // empty
        }
        topv.m_v_count = vt1-vt0;
      }
    }

    // build edge topology information
    const int topv_count = m_topv.Count();
    if ( topv_count >= 2 ) 
    {
      bool rc = false;
      int ei, ecnt, vi0, vi1, fi, efi, topfvi[4];
      ON_MeshFace f;

      if ( fcount > 0 && vcount > 0 ) 
      {
        // When working on this code be sure to test bug# 9271 and 9254 and file fsv_r4.3dm
        ON_Workspace ws;
        ON_MeshFaceSide* e = (ON_MeshFaceSide*)ws.GetMemory( 4*fcount*sizeof(*e) );
        ecnt = m_mesh->GetMeshFaceSideList( (const unsigned int*)m_topv_map.Array(), e );
        
        if ( ecnt > 0 ) 
        {
          rc = true;
          ON_MeshFaceSide::SortByVertexIndex( e, ecnt );

          // count number of topological edges and allocate storage
          int etop_count = 0;
          ei = 0;
          while( ei < ecnt ) 
          {
            vi0 = e[ei].m_vi[0];
            vi1 = e[ei].m_vi[1];
            ei++;
            while (ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 )
              ei++;
            etop_count++;
          }
          m_tope.SetCapacity(etop_count);

          // fill in the m_tope[] array information
          int* efindex = GetIntArray(ecnt);
          for ( ei = 0; ei < ecnt; /*empty*/ )
          {
            ON_MeshTopologyEdge& tope = m_tope.AppendNew();
            tope.m_topvi[0] = (int)(vi0 = e[ei].m_vi[0]);
            tope.m_topvi[1] = (int)(vi1 = e[ei].m_vi[1]);
            tope.m_topfi = efindex;
            tope.m_topf_count = 0;
            *efindex++ = (int)e[ei].m_fi;
            tope.m_topf_count++;
            ei++;
            while( ei < ecnt && e[ei].m_vi[0] == (unsigned int)vi0 && e[ei].m_vi[1] == (unsigned int)vi1 ) 
            {
              *efindex++ = (int)e[ei].m_fi;
              tope.m_topf_count++;
              ei++;
            }
          }
          efindex = 0; // memory deallocated by ~ON_MeshTopology()

          // connect vertices to edges;
          ecnt = m_tope.Count();
          int* ve_count = (int*)onmalloc(topv_count*sizeof(*ve_count));
          // set ve_count[topvi] = number of edges that begin or end at m_topv[topvi]
          memset( ve_count, 0, topv_count*sizeof(*ve_count));
          for ( ei = 0; ei < ecnt; ei++ ) {
            const ON_MeshTopologyEdge& tope = m_tope[ei];
            ve_count[tope.m_topvi[0]]++;
            ve_count[tope.m_topvi[1]]++;
          }
          // allocate and distribute storage for the mopv.m_topei[] array
          int* vei = GetIntArray(2*ecnt);
          for ( vi0 = 0; vi0 < topv_count; vi0++ ) {
            ON_MeshTopologyVertex& topv = m_topv[vi0];
            if ( ve_count[vi0] > 0 ) {
              topv.m_topei = vei;
              vei += ve_count[vi0];
            }
          }
          onfree(ve_count); ve_count = 0;
          vei = 0; // memory deallocated by ~ON_MeshTopology()

          // fill in the m_topv[].m_topei[] values
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
            ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
            vei = const_cast<int*>(topv0.m_topei);
            vei[topv0.m_tope_count++] = ei;
            vei = const_cast<int*>(topv1.m_topei);
            vei[topv1.m_tope_count++] = ei;
          }

          // build face topology information
          m_topf.SetCapacity(fcount);
          m_topf.SetCount(fcount);
          memset( m_topf.Array(), 0, fcount*sizeof(ON_MeshTopologyFace) );
          for ( fi = 0; fi < fcount; fi++ ) {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            f_local.m_topei[0] = -1;
            f_local.m_topei[1] = -1;
            f_local.m_topei[2] = -1;
            f_local.m_topei[3] = -1;
          }
          for ( ei = 0; ei < ecnt; ei++ ) {
            ON_MeshTopologyEdge& tope = m_tope[ei];
            for (efi = 0; efi < tope.m_topf_count; efi++ ) {
              // Because ON_MeshFace.vi[2] == ON_MeshFace.vi[3] for triangles,
              // we have topf.m_topei[j] BEGIN at ON_MeshFace.vi[(j+3)%4] and END at ON_MeshFace.vi[j]
              fi = tope.m_topfi[efi];
              f = m_mesh->m_F[fi];
              topfvi[0] = m_topv_map[f.vi[0]];
              topfvi[1] = m_topv_map[f.vi[1]];
              topfvi[2] = m_topv_map[f.vi[2]];
              topfvi[3] = m_topv_map[f.vi[3]];
              ON_MeshTopologyFace& topf = m_topf[fi];
              vi0 = tope.m_topvi[0];
              vi1 = tope.m_topvi[1];
              // unroll loop for speed
              if      ( vi0 == topfvi[3] && vi1 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 0;
              }
              else if ( vi0 == topfvi[0] && vi1 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 0;
              }
              else if ( vi0 == topfvi[1] && vi1 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 0;
              }
              else if ( vi0 == topfvi[2] && vi1 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 0;
              }
              else if ( vi1 == topfvi[3] && vi0 == topfvi[0] ) {
                topf.m_topei[0] = ei;
                topf.m_reve[0] = 1;
              }
              else if ( vi1 == topfvi[0] && vi0 == topfvi[1] ) {
                topf.m_topei[1] = ei;
                topf.m_reve[1] = 1;
              }
              else if ( vi1 == topfvi[1] && vi0 == topfvi[2] ) {
                topf.m_topei[2] = ei;
                topf.m_reve[2] = 1;
              }
              else if ( vi1 == topfvi[2] && vi0 == topfvi[3] ) {
                topf.m_topei[3] = ei;
                topf.m_reve[3] = 1;
              }
            }
          }
          for ( fi = 0; fi < fcount; fi++ ) 
          {
            ON_MeshTopologyFace& f_local = m_topf[fi];
            bool bIsGood = false;
            if (    f_local.m_topei[0] >= 0 && f_local.m_topei[1] >= 0 && f_local.m_topei[2] >=0 
                 && f_local.m_topei[0] != f_local.m_topei[1] 
                 && f_local.m_topei[1] != f_local.m_topei[2] 
                 && f_local.m_topei[2] != f_local.m_topei[0] 
                 ) {
              if ( m_mesh->m_F[fi].IsTriangle() ) {
                bIsGood = true;
                f_local.m_topei[3] = f_local.m_topei[2];
              }
              else if (   f_local.m_topei[3] >= 0 
                       && f_local.m_topei[0] != f_local.m_topei[3] 
                       && f_local.m_topei[1] != f_local.m_topei[3] 
                       && f_local.m_topei[2] != f_local.m_topei[3] ) {
                bIsGood = true;
              }
            }
            if ( !bIsGood ) {
              f_local.m_topei[0] = 0;
              f_local.m_topei[1] = 0;
              f_local.m_topei[2] = 0;
              f_local.m_topei[3] = 0;
              f_local.m_reve[0] = 0;
              f_local.m_reve[1] = 0;
              f_local.m_reve[2] = 0;
              f_local.m_reve[3] = 0;
            }
          }

        }
      }
    }

    b32IsValid = 1;
    break;
  }

  if ( -1 != b32IsValid0 )
  {
    // no sleep lock is in use
    m_b32IsValid = b32IsValid;
  }

  if ( 1 != b32IsValid )
  {
    Destroy();
  }

  return (1 == b32IsValid);
}